

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O1

void __thiscall
QRhiTextureUploadEntry::QRhiTextureUploadEntry
          (QRhiTextureUploadEntry *this,int layer,int level,
          QRhiTextureSubresourceUploadDescription *desc)

{
  Data *pDVar1;
  undefined8 uVar2;
  QPoint QVar3;
  quint32 qVar4;
  Representation RVar5;
  
  this->m_layer = layer;
  this->m_level = level;
  QImage::QImage(&(this->m_desc).m_image,&desc->m_image);
  pDVar1 = (desc->m_data).d.d;
  (this->m_desc).m_data.d.d = pDVar1;
  (this->m_desc).m_data.d.ptr = (desc->m_data).d.ptr;
  (this->m_desc).m_data.d.size = (desc->m_data).d.size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  qVar4 = desc->m_dataStride;
  RVar5.m_i = (desc->m_destinationTopLeft).xp.m_i;
  uVar2 = *(undefined8 *)&(desc->m_destinationTopLeft).yp;
  QVar3 = desc->m_sourceTopLeft;
  (this->m_desc).m_sourceSize = desc->m_sourceSize;
  (this->m_desc).m_sourceTopLeft = QVar3;
  (this->m_desc).m_dataStride = qVar4;
  (this->m_desc).m_destinationTopLeft.xp = (Representation)RVar5.m_i;
  *(undefined8 *)&(this->m_desc).m_destinationTopLeft.yp = uVar2;
  return;
}

Assistant:

QRhiTextureUploadEntry::QRhiTextureUploadEntry(int layer, int level,
                                               const QRhiTextureSubresourceUploadDescription &desc)
    : m_layer(layer),
      m_level(level),
      m_desc(desc)
{
}